

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O0

vw_exception * __thiscall VW::vw_exception::operator=(vw_exception *this,vw_exception *other)

{
  vw_exception *in_RSI;
  vw_exception *in_RDI;
  
  if (in_RSI != in_RDI) {
    in_RDI->file = in_RSI->file;
    std::__cxx11::string::operator=((string *)&in_RDI->message,(string *)&in_RSI->message);
    in_RDI->lineNumber = in_RSI->lineNumber;
  }
  return in_RDI;
}

Assistant:

vw_exception& vw_exception::operator=(const vw_exception& other)
{
  // check for self-assignment
  if (&other == this)
    return *this;

  file = other.file;
  message = other.message;
  lineNumber = other.lineNumber;

  return *this;
}